

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

PublicationInfo * __thiscall
helics::InterfaceInfo::getPublication(InterfaceInfo *this,string *pubName)

{
  PublicationInfo *pPVar1;
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock_shared(&local_28,&this->publications);
  pPVar1 = gmlc::containers::
           DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(local_28.data,pubName);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28.m_handle_lock);
  return pPVar1;
}

Assistant:

const PublicationInfo* InterfaceInfo::getPublication(const std::string& pubName) const
{
    return publications.lock_shared()->find(pubName);
}